

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall
SimpleLogger::put(SimpleLogger *this,int level,char *source_file,char *func_name,size_t line_number,
                 char *format,...)

{
  long lVar1;
  size_t sVar2;
  char in_AL;
  int iVar3;
  __int_type_conflict _Var4;
  int *piVar5;
  ulong uVar6;
  size_type *psVar7;
  size_t __n;
  ostream *this_00;
  long in_RCX;
  size_t *psVar8;
  long in_RDX;
  int iVar9;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  char *in_R9;
  int iVar10;
  long *in_FS_OFFSET;
  bool bVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unique_lock<std::mutex> l;
  LogElem *ll;
  uint64_t cursor_val;
  uint64_t cursor_exp;
  size_t num;
  va_list args;
  size_t msg_len;
  size_t avail_len;
  size_t cur_len;
  int tz_gap_abs;
  TimeInfo lt;
  size_t ii;
  size_t last_slash;
  int TID_DIGITS;
  char msg [4096];
  memory_order __b_1;
  memory_order __b;
  uint uVar12;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffea7c;
  uint uVar14;
  undefined4 uVar15;
  memory_order in_stack_ffffffffffffea84;
  undefined4 in_stack_ffffffffffffea88;
  uint uVar16;
  undefined4 in_stack_ffffffffffffea8c;
  undefined8 in_stack_ffffffffffffea98;
  undefined8 uVar17;
  char *pcVar18;
  TimeInfo *in_stack_ffffffffffffead8;
  time_point in_stack_ffffffffffffeae0;
  ulong local_1518;
  size_t local_1510;
  ulong local_1508;
  size_t local_1500;
  ulong local_14f8;
  size_t local_14f0;
  ulong local_14e8;
  size_t local_14e0;
  ulong local_14d8;
  long local_14d0;
  size_t local_14b0;
  size_t in_stack_ffffffffffffeb58;
  undefined4 in_stack_ffffffffffffeb60;
  undefined4 in_stack_ffffffffffffeb64;
  ulong local_1330;
  size_t local_1328;
  ulong local_1320;
  long local_1318;
  size_t local_12f8;
  ulong local_12f0;
  size_t local_12e8;
  ulong local_12e0;
  char local_1299;
  int local_128c;
  undefined1 local_1258 [48];
  undefined8 local_1228;
  undefined8 local_1218;
  undefined8 local_1208;
  undefined8 local_11f8;
  undefined8 local_11e8;
  undefined8 local_11d8;
  undefined8 local_11c8;
  undefined8 local_11b8;
  reference local_1188;
  size_t local_1180;
  size_t local_1178;
  size_type local_1170;
  undefined4 local_1168;
  undefined4 local_1164;
  undefined1 *local_1160;
  undefined1 *local_1158;
  ulong local_1148;
  ulong local_1140;
  ulong local_1138;
  int local_112c;
  undefined8 local_1128;
  uint local_1120;
  uint local_111c;
  uint local_1118;
  uint local_1114;
  uint local_1110;
  uint local_110c;
  undefined4 local_1108;
  undefined4 local_1104;
  long local_1100;
  long local_10f8;
  __int_type_conflict local_10ec;
  char local_10e8 [4104];
  char *local_e0;
  undefined8 local_d8;
  long local_d0;
  long local_c8;
  int local_bc;
  long local_b8;
  undefined4 local_ac;
  size_t local_a8;
  size_t *local_a0;
  size_t *local_98;
  size_type local_90;
  memory_order local_88;
  int local_84;
  size_type *local_80;
  int local_74;
  memory_order local_70;
  int local_6c;
  int *local_68;
  bool local_59;
  size_t local_58;
  memory_order local_50;
  undefined4 local_4c;
  size_t local_48;
  size_t *local_40;
  size_t *local_38;
  
  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffea98 >> 0x20);
  if (in_AL != '\0') {
    local_1228 = in_XMM0_Qa;
    local_1218 = in_XMM1_Qa;
    local_1208 = in_XMM2_Qa;
    local_11f8 = in_XMM3_Qa;
    local_11e8 = in_XMM4_Qa;
    local_11d8 = in_XMM5_Qa;
    local_11c8 = in_XMM6_Qa;
    local_11b8 = in_XMM7_Qa;
  }
  piVar5 = (int *)(in_RDI + 0x244);
  local_6c = 0;
  local_e0 = in_R9;
  local_d8 = in_R8;
  local_d0 = in_RCX;
  local_c8 = in_RDX;
  local_bc = in_ESI;
  local_b8 = in_RDI;
  local_68 = piVar5;
  local_70 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_6c - 1U < 2) {
    local_74 = *piVar5;
  }
  else if (local_6c == 5) {
    local_74 = *piVar5;
  }
  else {
    local_74 = *piVar5;
  }
  if ((in_ESI <= local_74) &&
     (uVar6 = std::ios::operator!((ios *)(in_RDI + 0x38 +
                                         *(long *)(*(long *)(in_RDI + 0x38) + -0x18))),
     (uVar6 & 1) == 0)) {
    if (*(char *)(*in_FS_OFFSET + -0x10) == '\0') {
      lVar1 = *in_FS_OFFSET;
      ThreadWrapper::ThreadWrapper
                ((ThreadWrapper *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60));
      __cxa_thread_atexit(ThreadWrapper::~ThreadWrapper,lVar1 + -0x20,&__dso_handle);
      *(undefined1 *)(*in_FS_OFFSET + -0x10) = 1;
    }
    local_10ec = std::__atomic_base::operator_cast_to_int
                           ((__atomic_base<int> *)
                            CONCAT44(in_stack_ffffffffffffea8c,in_stack_ffffffffffffea88));
    if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
      *(undefined4 *)(*in_FS_OFFSET + -0xc) = *(undefined4 *)(*in_FS_OFFSET + -0x18);
      *(undefined1 *)(*in_FS_OFFSET + -8) = 1;
    }
    local_10f8 = 0;
    local_1100 = 0;
    while( true ) {
      bVar11 = false;
      if (local_c8 != 0) {
        bVar11 = *(char *)(local_c8 + local_1100) != '\0';
      }
      if (!bVar11) break;
      if ((*(char *)(local_c8 + local_1100) == '/') || (*(char *)(local_c8 + local_1100) == '\\')) {
        local_10f8 = local_1100;
      }
      local_1100 = local_1100 + 1;
    }
    local_1128 = std::chrono::_V2::system_clock::now();
    SimpleLoggerMgr::TimeInfo::TimeInfo(in_stack_ffffffffffffead8,in_stack_ffffffffffffeae0);
    if (*(int *)(in_RDI + 0x278) < 0) {
      local_128c = -*(int *)(in_RDI + 0x278);
    }
    else {
      local_128c = *(int *)(in_RDI + 0x278);
    }
    local_112c = local_128c;
    local_1138 = 0;
    local_1148 = 0;
    local_1140 = 0x1000;
    local_1299 = '+';
    if (*(int *)(in_RDI + 0x278) < 0) {
      local_1299 = '-';
    }
    iVar10 = (int)local_1299;
    iVar9 = local_128c / 0x3c;
    local_128c = local_128c % 0x3c;
    uVar15 = *(undefined4 *)(*in_FS_OFFSET + -0xc);
    pcVar18 = put::lv_names[local_bc];
    uVar17 = CONCAT44(uVar13,local_1104);
    uVar12 = local_1114;
    uVar14 = local_1110;
    uVar16 = local_110c;
    uVar13 = local_1108;
    _Var4 = local_10ec;
    iVar3 = snprintf(local_10e8,0x1000,
                     "%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d [%*u] [%s] ",
                     (ulong)local_1120,(ulong)local_111c,(ulong)local_1118,local_1114,local_1110,
                     local_110c,local_1108,uVar17,iVar10,iVar9,local_128c,local_10ec,uVar15,pcVar18)
    ;
    local_1148 = (ulong)iVar3;
    local_12e0 = local_1148;
    if (local_1140 <= local_1148) {
      local_12e0 = local_1140;
    }
    local_1138 = local_12e0 + local_1138;
    local_1158 = local_1258;
    local_1160 = &stack0x00000008;
    local_1164 = 0x30;
    local_1168 = 0x30;
    if (local_1138 < local_1140) {
      local_12e8 = local_1140 - local_1138;
    }
    else {
      local_12e8 = 0;
    }
    local_1140 = local_12e8;
    iVar3 = vsnprintf(local_10e8 + local_1138,local_12e8,local_e0,&local_1168);
    local_1148 = (ulong)iVar3;
    local_12f0 = local_1148;
    if (local_1140 <= local_1148) {
      local_12f0 = local_1140;
    }
    local_1138 = local_12f0 + local_1138;
    if ((local_c8 == 0) || (local_d0 == 0)) {
      if (local_1138 < local_1140) {
        local_1328 = local_1140 - local_1138;
      }
      else {
        local_1328 = 0;
      }
      local_1140 = local_1328;
      iVar3 = snprintf(local_10e8 + local_1138,local_1328,"\n");
      local_1148 = (ulong)iVar3;
      local_1330 = local_1148;
      if (local_1140 <= local_1148) {
        local_1330 = local_1140;
      }
      local_1138 = local_1330 + local_1138;
    }
    else {
      if (local_1138 < local_1140) {
        local_12f8 = local_1140 - local_1138;
      }
      else {
        local_12f8 = 0;
      }
      local_1140 = local_12f8;
      if (local_10f8 == 0) {
        local_1318 = 0;
      }
      else {
        local_1318 = local_10f8 + 1;
      }
      iVar3 = snprintf(local_10e8 + local_1138,local_12f8,"\t[%s:%zu, %s()]\n",local_c8 + local_1318
                       ,local_d8,local_d0,uVar12,uVar14,uVar16,uVar13,uVar17,iVar10,iVar9,local_128c
                       ,_Var4,uVar15,pcVar18);
      local_1148 = (ulong)iVar3;
      local_1320 = local_1148;
      if (local_1140 <= local_1148) {
        local_1320 = local_1140;
      }
      local_1138 = local_1320 + local_1138;
    }
    local_1170 = std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::size
                           ((vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_> *
                            )(in_RDI + 0x288));
    local_1178 = 0;
    local_1180 = 0;
    local_1188 = (reference)0x0;
    do {
      psVar7 = (size_type *)(in_RDI + 0x280);
      local_84 = 0;
      local_80 = psVar7;
      local_88 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_84 - 1U < 2) {
        local_90 = *psVar7;
      }
      else if (local_84 == 5) {
        local_90 = *psVar7;
      }
      else {
        local_90 = *psVar7;
      }
      local_1178 = local_90;
      local_1180 = (local_90 + 1) % local_1170;
      local_1188 = std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::
                   operator[]((vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>
                               *)(in_RDI + 0x288),local_90);
      sVar2 = local_1180;
      psVar8 = (size_t *)(in_RDI + 0x280);
      local_a8 = local_1180;
      local_ac = 0;
      local_a0 = &local_1178;
      local_98 = psVar8;
      local_50 = std::__cmpexch_failure_order(in_stack_ffffffffffffea84);
      local_48 = sVar2;
      local_4c = 0;
      local_58 = sVar2;
      if (local_50 - memory_order_consume < 2) {
        LOCK();
        __n = *psVar8;
        local_59 = local_1178 == __n;
        if (local_59) {
          *psVar8 = sVar2;
          __n = local_1178;
        }
        UNLOCK();
        if (!local_59) {
          local_1178 = __n;
        }
      }
      else if (local_50 == memory_order_seq_cst) {
        LOCK();
        __n = *psVar8;
        local_59 = local_1178 == __n;
        if (local_59) {
          *psVar8 = sVar2;
          __n = local_1178;
        }
        UNLOCK();
        if (!local_59) {
          local_1178 = __n;
        }
      }
      else {
        LOCK();
        __n = *psVar8;
        local_59 = local_1178 == __n;
        if (local_59) {
          *psVar8 = sVar2;
          __n = local_1178;
        }
        UNLOCK();
        if (!local_59) {
          local_1178 = __n;
        }
      }
      local_40 = &local_1178;
      local_38 = psVar8;
    } while (((local_59 ^ 0xffU) & 1) != 0);
    while (bVar11 = LogElem::available((LogElem *)CONCAT44(in_stack_ffffffffffffea84,uVar14)),
          ((bVar11 ^ 0xffU) & 1) != 0) {
      std::this_thread::yield();
    }
    bVar11 = LogElem::needToFlush((LogElem *)0x14f461);
    if ((bVar11) &&
       (bVar11 = flush((SimpleLogger *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60)
                       ,in_stack_ffffffffffffeb58), !bVar11)) {
      while (bVar11 = LogElem::needToFlush((LogElem *)0x14f48f), bVar11) {
        std::this_thread::yield();
      }
    }
    LogElem::write(local_1188,(int)local_1138,local_10e8,__n);
    iVar3 = local_bc;
    _Var4 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)CONCAT44(in_stack_ffffffffffffea8c,uVar16));
    if (iVar3 <= _Var4) {
      local_1138 = 0;
      local_1140 = 0x1000;
      uVar13 = *(undefined4 *)(*in_FS_OFFSET + -0xc);
      pcVar18 = put::colored_lv_names[local_bc];
      _Var4 = local_10ec;
      iVar3 = snprintf(local_10e8,0x1000,
                       " [\x1b[33m%02d\x1b[0m:\x1b[33m%02d\x1b[0m:\x1b[33m%02d\x1b[0m.\x1b[33m%03d\x1b[0m \x1b[33m%03d\x1b[0m] [tid \x1b[1;34m%*u\x1b[0m] [%s] "
                       ,(ulong)local_1114,(ulong)local_1110,(ulong)local_110c,local_1108,local_1104,
                       local_10ec,uVar13,pcVar18);
      local_1148 = (ulong)iVar3;
      uVar6 = local_1140;
      if (local_1148 < local_1140) {
        uVar6 = local_1148;
      }
      local_1138 = uVar6 + local_1138;
      if ((local_c8 == 0) || (local_d0 == 0)) {
        if (local_1138 < local_1140) {
          local_14e0 = local_1140 - local_1138;
        }
        else {
          local_14e0 = 0;
        }
        local_1140 = local_14e0;
        iVar3 = snprintf(local_10e8 + local_1138,local_14e0,"\n");
        local_1148 = (ulong)iVar3;
        local_14e8 = local_1148;
        if (local_1140 <= local_1148) {
          local_14e8 = local_1140;
        }
        local_1138 = local_14e8 + local_1138;
        uVar13 = local_1108;
        uVar15 = local_1104;
      }
      else {
        if (local_1138 < local_1140) {
          local_14b0 = local_1140 - local_1138;
        }
        else {
          local_14b0 = 0;
        }
        local_1140 = local_14b0;
        if (local_10f8 == 0) {
          local_14d0 = 0;
        }
        else {
          local_14d0 = local_10f8 + 1;
        }
        iVar3 = snprintf(local_10e8 + local_1138,local_14b0,
                         "[\x1b[32m%s\x1b[0m:\x1b[1;31m%zu\x1b[0m, \x1b[36m%s()\x1b[0m]\n",
                         local_c8 + local_14d0,local_d8,local_d0,local_1108,local_1104,_Var4,uVar13,
                         pcVar18);
        local_1148 = (ulong)iVar3;
        local_14d8 = local_1148;
        if (local_1140 <= local_1148) {
          local_14d8 = local_1140;
        }
        local_1138 = local_14d8 + local_1138;
        uVar13 = local_1108;
        uVar15 = local_1104;
      }
      local_1158 = local_1258;
      local_1160 = &stack0x00000008;
      local_1164 = 0x30;
      local_1168 = 0x30;
      if (local_bc == 0) {
        if (local_1138 < local_1140) {
          local_14f0 = local_1140 - local_1138;
        }
        else {
          local_14f0 = 0;
        }
        local_1140 = local_14f0;
        iVar3 = snprintf(local_10e8 + local_1138,local_14f0,"\x1b[1;33m");
        local_1148 = (ulong)iVar3;
        local_14f8 = local_1148;
        if (local_1140 <= local_1148) {
          local_14f8 = local_1140;
        }
        local_1138 = local_14f8 + local_1138;
      }
      else if (local_bc == 1) {
        if (local_1138 < local_1140) {
          local_1500 = local_1140 - local_1138;
        }
        else {
          local_1500 = 0;
        }
        local_1140 = local_1500;
        iVar3 = snprintf(local_10e8 + local_1138,local_1500,"\x1b[1;31m");
        local_1148 = (ulong)iVar3;
        local_1508 = local_1148;
        if (local_1140 <= local_1148) {
          local_1508 = local_1140;
        }
        local_1138 = local_1508 + local_1138;
      }
      if (local_1138 < local_1140) {
        local_1510 = local_1140 - local_1138;
      }
      else {
        local_1510 = 0;
      }
      local_1140 = local_1510;
      iVar3 = vsnprintf(local_10e8 + local_1138,local_1510,local_e0,&local_1168);
      local_1148 = (ulong)iVar3;
      local_1518 = local_1148;
      if (local_1140 <= local_1148) {
        local_1518 = local_1140;
      }
      local_1138 = local_1518 + local_1138;
      if (local_1138 < local_1140) {
        local_1140 = local_1140 - local_1138;
      }
      else {
        local_1140 = 0;
      }
      iVar3 = snprintf(local_10e8 + local_1138,local_1140,"\x1b[0m");
      local_1148 = (ulong)iVar3;
      uVar6 = local_1140;
      if (local_1148 < local_1140) {
        uVar6 = local_1148;
      }
      local_1138 = local_1138 + uVar6;
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)CONCAT44(in_stack_ffffffffffffea84,uVar15),
                 (mutex_type *)CONCAT44(in_stack_ffffffffffffea7c,uVar13));
      this_00 = std::operator<<((ostream *)&std::cout,local_10e8);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::unique_lock<std::mutex>::unlock
                ((unique_lock<std::mutex> *)CONCAT44(in_stack_ffffffffffffea84,uVar15));
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)CONCAT44(in_stack_ffffffffffffea84,uVar15));
    }
  }
  return;
}

Assistant:

void SimpleLogger::put(int level,
                       const char* source_file,
                       const char* func_name,
                       size_t line_number,
                       const char* format,
                       ...)
{
    if (level > curLogLevel.load(MOR)) return;
    if (!fs) return;

    static const char* lv_names[7] = {"====",
                                      "FATL", "ERRO", "WARN",
                                      "INFO", "DEBG", "TRAC"};
    char msg[MSG_SIZE];
    thread_local ThreadWrapper thread_wrapper;
#ifdef __linux__
    const int TID_DIGITS = tid_digits;
    thread_local uint32_t tid_hash = thread_wrapper.myTid;
#else
    thread_local std::thread::id tid = std::this_thread::get_id();
    thread_local uint32_t tid_hash = std::hash<std::thread::id>{}(tid) % 0x10000;
#endif

    // Print filename part only (excluding directory path).
    size_t last_slash = 0;
    for (size_t ii=0; source_file && source_file[ii] != 0; ++ii) {
        if (source_file[ii] == '/' || source_file[ii] == '\\') last_slash = ii;
    }

    SimpleLoggerMgr::TimeInfo lt( std::chrono::system_clock::now() );
    int tz_gap_abs = (tzGap < 0) ? (tzGap * -1) : (tzGap);

    // [time] [tid] [log type] [user msg] [stack info]
    // Timestamp: ISO 8601 format.
    size_t cur_len = 0;
    size_t avail_len = MSG_SIZE;
    size_t msg_len = 0;

#ifdef __linux__
    _snprintf( msg, avail_len, cur_len, msg_len,
               "%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d "
               "[%*u] "
               "[%s] ",
               lt.year, lt.month, lt.day,
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               (tzGap >= 0)?'+':'-', tz_gap_abs / 60, tz_gap_abs % 60,
               TID_DIGITS, tid_hash,
               lv_names[level] );
#else
    _snprintf( msg, avail_len, cur_len, msg_len,
               "%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d "
               "[%04x] "
               "[%s] ",
               lt.year, lt.month, lt.day,
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               (tzGap >= 0)?'+':'-', tz_gap_abs / 60, tz_gap_abs % 60,
               tid_hash,
               lv_names[level] );
#endif

    va_list args;
    va_start(args, format);
    _vsnprintf(msg, avail_len, cur_len, msg_len, format, args);
    va_end(args);

    if (source_file && func_name) {
        _snprintf( msg, avail_len, cur_len, msg_len,
                   "\t[%s:%zu, %s()]\n",
                   source_file + ((last_slash)?(last_slash+1):0),
                   line_number, func_name );
    } else {
        _snprintf(msg, avail_len, cur_len, msg_len, "\n");
    }

    size_t num = logs.size();
    uint64_t cursor_exp = 0, cursor_val = 0;
    LogElem* ll = nullptr;
    do {
        cursor_exp = cursor.load(MOR);
        cursor_val = (cursor_exp + 1) % num;
        ll = &logs[cursor_exp];
    } while ( !cursor.compare_exchange_strong(cursor_exp, cursor_val, MOR) );
    while ( !ll->available() ) std::this_thread::yield();

    if (ll->needToFlush()) {
        // Allow only one thread to flush.
        if (!flush(cursor_exp)) {
            // Other threads: wait.
            while (ll->needToFlush()) std::this_thread::yield();
        }
    }
    ll->write(cur_len, msg);

    if (level > curDispLevel) return;

    // Console part.
    static const char* colored_lv_names[7] =
                       { _CL_B_BROWN("===="),
                         _CL_WHITE_FG_RED_BG("FATL"),
                         _CL_B_RED("ERRO"),
                         _CL_B_MAGENTA("WARN"),
                         "INFO",
                         _CL_D_GRAY("DEBG"),
                         _CL_D_GRAY("TRAC") };

    cur_len = 0;
    avail_len = MSG_SIZE;
#ifdef __linux__
    _snprintf( msg, avail_len, cur_len, msg_len,
               " [" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") "."
               _CL_BROWN("%03d") " " _CL_BROWN("%03d")
               "] [tid " _CL_B_BLUE("%*u") "] "
               "[%s] ",
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               TID_DIGITS, tid_hash,
               colored_lv_names[level] );
#else
    _snprintf( msg, avail_len, cur_len, msg_len,
               " [" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") "."
               _CL_BROWN("%03d") " " _CL_BROWN("%03d")
               "] [tid " _CL_B_BLUE("%04x") "] "
               "[%s] ",
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               tid_hash,
               colored_lv_names[level] );
#endif

    if (source_file && func_name) {
        _snprintf( msg, avail_len, cur_len, msg_len,
                   "[" _CL_GREEN("%s") ":" _CL_B_RED("%zu")
                   ", " _CL_CYAN("%s()") "]\n",
                   source_file + ((last_slash)?(last_slash+1):0),
                   line_number, func_name );
    } else {
        _snprintf(msg, avail_len, cur_len, msg_len, "\n");
    }

    va_start(args, format);

#ifndef LOGGER_NO_COLOR
    if (level == 0) {
        _snprintf(msg, avail_len, cur_len, msg_len, _CLM_B_BROWN);
    } else if (level == 1) {
        _snprintf(msg, avail_len, cur_len, msg_len, _CLM_B_RED);
    }
#endif

    _vsnprintf(msg, avail_len, cur_len, msg_len, format, args);

#ifndef LOGGER_NO_COLOR
    _snprintf(msg, avail_len, cur_len, msg_len, _CLM_END);
#endif

    va_end(args);
    (void)cur_len;

    std::unique_lock<std::mutex> l(SimpleLoggerMgr::displayLock);
    std::cout << msg << std::endl;
    l.unlock();
}